

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

string * doctest::(anonymous_namespace)::JUnitReporter::JUnitTestCaseData::
         getCurrentTimestamp_abi_cxx11_(void)

{
  string *in_RDI;
  char *fmt;
  char timeStamp [21];
  tm timeInfo;
  unsigned_long timeStampSize;
  time_t rawtime;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *this;
  char local_68 [24];
  tm local_50;
  undefined8 local_18;
  time_t local_10 [2];
  
  time(local_10);
  local_18 = 0x15;
  gmtime_r(local_10,&local_50);
  this = "%Y-%m-%dT%H:%M:%SZ";
  strftime(local_68,0x15,"%Y-%m-%dT%H:%M:%SZ",&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff8f);
  return in_RDI;
}

Assistant:

static std::string getCurrentTimestamp() {
                // Beware, this is not reentrant because of backward compatibility issues
                // Also, UTC only, again because of backward compatibility (%z is C++11)
                time_t rawtime;
                std::time(&rawtime);
                auto const timeStampSize = sizeof("2017-01-16T17:06:45Z");

                std::tm timeInfo;
#ifdef DOCTEST_PLATFORM_WINDOWS
                gmtime_s(&timeInfo, &rawtime);
#else // DOCTEST_PLATFORM_WINDOWS
                gmtime_r(&rawtime, &timeInfo);
#endif // DOCTEST_PLATFORM_WINDOWS

                char timeStamp[timeStampSize];
                const char* const fmt = "%Y-%m-%dT%H:%M:%SZ";

                std::strftime(timeStamp, timeStampSize, fmt, &timeInfo);
                return std::string(timeStamp);
            }